

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_prediction_scheme_geometric_normal_predictor_area.h
# Opt level: O0

bool __thiscall
draco::
MeshPredictionSchemeGeometricNormalPredictorArea<int,_draco::PredictionSchemeNormalOctahedronCanonicalizedEncodingTransform<int>,_draco::MeshPredictionSchemeData<draco::MeshAttributeCornerTable>_>
::SetNormalPredictionMode
          (MeshPredictionSchemeGeometricNormalPredictorArea<int,_draco::PredictionSchemeNormalOctahedronCanonicalizedEncodingTransform<int>,_draco::MeshPredictionSchemeData<draco::MeshAttributeCornerTable>_>
           *this,NormalPredictionMode mode)

{
  NormalPredictionMode mode_local;
  MeshPredictionSchemeGeometricNormalPredictorArea<int,_draco::PredictionSchemeNormalOctahedronCanonicalizedEncodingTransform<int>,_draco::MeshPredictionSchemeData<draco::MeshAttributeCornerTable>_>
  *this_local;
  bool local_1;
  
  if (mode == ONE_TRIANGLE) {
    (this->
    super_MeshPredictionSchemeGeometricNormalPredictorBase<int,_draco::PredictionSchemeNormalOctahedronCanonicalizedEncodingTransform<int>,_draco::MeshPredictionSchemeData<draco::MeshAttributeCornerTable>_>
    ).normal_prediction_mode_ = ONE_TRIANGLE;
    local_1 = true;
  }
  else if (mode == TRIANGLE_AREA) {
    (this->
    super_MeshPredictionSchemeGeometricNormalPredictorBase<int,_draco::PredictionSchemeNormalOctahedronCanonicalizedEncodingTransform<int>,_draco::MeshPredictionSchemeData<draco::MeshAttributeCornerTable>_>
    ).normal_prediction_mode_ = TRIANGLE_AREA;
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool SetNormalPredictionMode(NormalPredictionMode mode) override {
    if (mode == ONE_TRIANGLE) {
      this->normal_prediction_mode_ = mode;
      return true;
    } else if (mode == TRIANGLE_AREA) {
      this->normal_prediction_mode_ = mode;
      return true;
    }
    return false;
  }